

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

void __thiscall
glslang::TSymbolValidater::operator()
          (TSymbolValidater *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  long lVar1;
  EShLanguage language;
  TIntermSymbol *pTVar2;
  pointer pTVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar10;
  undefined4 extraout_var_03;
  long *plVar11;
  _Base_ptr p_Var12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  iterator iVar13;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TString *name;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TType *pTVar14;
  TQualifier *pTVar15;
  TType *type;
  TType *this_00;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TTypeList *pTVar16;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TType *pTVar17;
  ulong uVar18;
  bool *pbVar19;
  char *__lhs;
  _Self __tmp;
  TVarLiveMap *pTVar20;
  uint uVar21;
  ulong uVar22;
  EShLanguage language_00;
  TString mangleName2;
  TString mangleName1;
  TType subType;
  TString err_4;
  
  pTVar2 = (entKey->second).symbol;
  iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar2);
  pTVar17 = (TType *)CONCAT44(extraout_var,iVar7);
  mangleName1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  mangleName1._M_string_length = 0;
  mangleName1.field_2._M_local_buf[0] = '\0';
  mangleName1._M_dataplus._M_p = (pointer)&mangleName1.field_2;
  mangleName2._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  mangleName2._M_string_length = 0;
  mangleName2.field_2._M_local_buf[0] = '\0';
  language = (entKey->second).stage;
  lVar9 = (long)(int)language;
  language_00 = EShLangCount;
  uVar22 = (ulong)language;
  uVar18 = (ulong)language;
  do {
    uVar18 = uVar18 - 1;
    if ((int)uVar22 < 1) {
      uVar22 = 0xe;
      break;
    }
    uVar22 = (ulong)((int)uVar22 - 1);
  } while (this->inVarMaps[uVar18 & 0xffffffff] == (TVarLiveMap *)0x0);
  do {
    if (0xc < lVar9) goto LAB_003752db;
    lVar1 = lVar9 + 1;
    lVar4 = lVar9 + 1;
    lVar9 = lVar1;
  } while (this->inVarMaps[lVar4] == (TVarLiveMap *)0x0);
  language_00 = (EShLanguage)lVar1;
LAB_003752db:
  mangleName2._M_dataplus._M_p = (pointer)&mangleName2.field_2;
  iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
  bVar5 = TQualifier::isArrayedIo((TQualifier *)CONCAT44(extraout_var_00,iVar7),language);
  pTVar14 = pTVar17;
  if (bVar5) {
    TType::TType(&subType,pTVar17,0,false);
    pTVar14 = &subType;
  }
  TType::appendMangledName(pTVar14,&mangleName1);
  iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar2);
  if ((*(uint *)(CONCAT44(extraout_var_01,iVar7) + 8) & 0x7f) == 3) {
    if ((EShLanguage)uVar22 == EShLangCount) {
      return;
    }
    iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(pTVar2);
    if (CONCAT44(extraout_var_02,iVar7) < 0x300000000000000) {
      return;
    }
    if (&this->outVarMaps[uVar22]->_M_t ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         *)0x0) {
      return;
    }
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
             ::find(&this->outVarMaps[uVar22]->_M_t,&entKey->first);
    iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar2);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x58))
                      ((long *)CONCAT44(extraout_var_03,iVar7));
    pTVar20 = this->outVarMaps[uVar22];
    iVar13 = iVar10;
    if (((_Rb_tree_header *)iVar10._M_node == &(pTVar20->_M_t)._M_impl.super__Rb_tree_header) &&
       (uVar21 = *(uint *)(lVar9 + 0x1c) & 0xfff, uVar21 != 0xfff)) {
      for (p_Var12 = (pTVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar13 = iVar10, p_Var12 != iVar10._M_node;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        plVar11 = (long *)(**(code **)(*(long *)p_Var12[2]._M_left + 0xf0))();
        lVar9 = (**(code **)(*plVar11 + 0x58))(plVar11);
        iVar13._M_node = p_Var12;
        if ((*(uint *)(lVar9 + 0x1c) & 0xfff) == uVar21) break;
      }
      pTVar20 = this->outVarMaps[uVar22];
    }
    iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar2);
    pTVar17 = (TType *)CONCAT44(extraout_var_14,iVar7);
    if ((_Rb_tree_header *)iVar13._M_node == &(pTVar20->_M_t)._M_impl.super__Rb_tree_header) {
      iVar7 = (*pTVar17->_vptr_TType[0x29])(pTVar17);
      if ((char)iVar7 != '\0') {
        return;
      }
      if (this->profile != EEsProfile) {
        return;
      }
      if ((entKey->second).live != true) {
        return;
      }
      *this->hadError = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &subType,&entKey->first,
                     ": not been declare as a output variable in pre shader stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,(char *)subType._8_8_);
      return;
    }
    pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    if (*this->hadError == true) {
      *this->hadError = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subType,(entKey->first)._M_dataplus._M_p,(allocator<char> *)&err_4);
      bVar5 = typeCheck(this,pTVar17,pTVar14,(string *)&subType,false);
      *this->hadError = bVar5;
      std::__cxx11::string::_M_dispose();
    }
    plVar11 = (long *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    pTVar15 = (TQualifier *)(**(code **)(*plVar11 + 0x58))(plVar11);
    bVar5 = TQualifier::isArrayedIo(pTVar15,(EShLanguage)uVar22);
    if (bVar5) {
      type = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
      this_00 = &subType;
      TType::TType(this_00,type,0,false);
    }
    else {
      this_00 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    }
    TType::appendMangledName(this_00,&mangleName2);
    bVar5 = std::operator==(&mangleName1,&mangleName2);
    if (bVar5) {
      if (this->profile != EEsProfile) {
        return;
      }
      if (this->version != 300) {
        return;
      }
      if ((entKey->second).stage != EShLangFragment) {
        return;
      }
      iVar7 = (*pTVar17->_vptr_TType[0x29])(pTVar17);
      if ((char)iVar7 != '\0') {
        return;
      }
      iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
      iVar7 = *(int *)(CONCAT44(extraout_var_15,iVar7) + 8);
      iVar8 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
      if (iVar7 < 0 != ((*(byte *)(CONCAT44(extraout_var_16,iVar8) + 0xb) & 0x80) == 0)) {
        iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
        uVar18 = *(ulong *)(CONCAT44(extraout_var_17,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
        if (((uVar18 ^ *(ulong *)(CONCAT44(extraout_var_18,iVar7) + 8)) >> 0x25 & 1) == 0) {
          return;
        }
      }
      __lhs = "Interpolation qualifier mismatch : ";
      goto LAB_00375be9;
    }
    iVar7 = (*pTVar17->_vptr_TType[7])(pTVar17);
    if (((iVar7 == 0x10) && (iVar7 = (*pTVar17->_vptr_TType[0x25])(pTVar17), (char)iVar7 != '\0'))
       && (iVar7 = (*pTVar14->_vptr_TType[0x25])(pTVar14), (char)iVar7 == '\0')) {
      subType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
      subType.qualifier.semanticName = (char *)0x0;
      subType.qualifier._8_1_ = 0;
      subType._8_8_ = &subType.qualifier.field_0x8;
      pTVar16 = TType::getStruct(pTVar17);
      TType::appendMangledName
                (((pTVar16->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type,(TString *)&subType);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)&subType,&mangleName2);
      if (bVar5) {
        iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
        uVar21 = *(uint *)(CONCAT44(extraout_var_19,iVar7) + 0x1c);
        iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
        if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_20,iVar7) + 0x1c)) & 0xfff) == 0) {
          return;
        }
      }
    }
    iVar7 = (*pTVar14->_vptr_TType[7])(pTVar14);
    if (((iVar7 == 0x10) && (iVar7 = (*pTVar14->_vptr_TType[0x25])(pTVar14), (char)iVar7 != '\0'))
       && (iVar7 = (*pTVar17->_vptr_TType[0x25])(pTVar17), (char)iVar7 == '\0')) {
      subType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
      subType.qualifier.semanticName = (char *)0x0;
      subType.qualifier._8_1_ = 0;
      subType._8_8_ = &subType.qualifier.field_0x8;
      pTVar16 = TType::getStruct(pTVar14);
      TType::appendMangledName
                (((pTVar16->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type,(TString *)&subType);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)&subType,&mangleName1);
      if (bVar5) {
        iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
        uVar21 = *(uint *)(CONCAT44(extraout_var_21,iVar7) + 0x1c);
        iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
        if (((uVar21 ^ *(uint *)(CONCAT44(extraout_var_22,iVar7) + 0x1c)) & 0xfff) == 0) {
          return;
        }
      }
    }
  }
  else {
    iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar2);
    if ((*(uint *)(CONCAT44(extraout_var_04,iVar7) + 8) & 0x7f) != 4) {
      iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar2);
      if (1 < (*(uint *)(CONCAT44(extraout_var_06,iVar7) + 8) & 0x7f) - 5) {
        return;
      }
      iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar2);
      if (*(char *)(CONCAT44(extraout_var_07,iVar7) + 0x2d) != '\0') {
        return;
      }
      uVar18 = 0;
      do {
        if (uVar18 == 0xe) {
          return;
        }
        if ((uVar18 != language) && (this->outVarMaps[uVar18] != (TVarLiveMap *)0x0)) {
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(&this->uniformVarMap[uVar18]->_M_t,&entKey->first);
          if ((_Rb_tree_header *)iVar13._M_node ==
              &(this->uniformVarMap[uVar18]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])
                              (pTVar2);
            if (iVar7 == 0x10) {
              iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                (pTVar2);
              bVar5 = IsAnonymous((TString *)CONCAT44(extraout_var_11,iVar7));
              if (bVar5) {
                iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar2);
                pTVar16 = TType::getStruct((TType *)CONCAT44(extraout_var_12,iVar7));
                lVar9 = 0;
                for (uVar22 = 0;
                    pTVar3 = (pTVar16->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                    uVar22 < (ulong)((long)(pTVar16->
                                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ).
                                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3
                                    >> 5); uVar22 = uVar22 + 1) {
                  __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(**(long **)((long)&pTVar3->type + lVar9) + 0x30))();
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)&subType,__str);
                  iVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                           ::find(&this->uniformVarMap[uVar18]->_M_t,(key_type *)&subType);
                  if ((_Rb_tree_header *)iVar13._M_node !=
                      &(this->uniformVarMap[uVar18]->_M_t)._M_impl.super__Rb_tree_header) {
                    std::operator+(&err_4,"Invalid Uniform variable name : ",
                                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)&subType);
                    TInfoSinkBase::message
                              (&this->infoSink->info,EPrefixInternalError,err_4._M_dataplus._M_p);
                    *this->hadError = true;
                    break;
                  }
                  lVar9 = lVar9 + 0x20;
                }
              }
            }
          }
          else {
            pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
            TType::appendMangledName(pTVar14,&mangleName2);
            bVar5 = std::operator!=(&mangleName1,&mangleName2);
            if (bVar5) {
              pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
              TType::sameElementType(pTVar14,pTVar17,(int *)0x0,(int *)0x0);
              std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)&subType,"Invalid Uniform variable type : ",&entKey->first);
              TInfoSinkBase::message
                        (&this->infoSink->info,EPrefixInternalError,(char *)subType._8_8_);
              *this->hadError = true;
            }
            mangleName2._M_string_length = 0;
            *mangleName2._M_dataplus._M_p = '\0';
            if (*this->hadError == false) {
              iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar2);
              iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x38))
                                ((long *)CONCAT44(extraout_var_08,iVar7));
              if (iVar7 == 0x10) {
                iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                  (pTVar2);
                bVar5 = IsAnonymous((TString *)CONCAT44(extraout_var_09,iVar7));
                name = (TString *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 400))();
                bVar6 = IsAnonymous(name);
                if (bVar5 != bVar6) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)&subType,
                                 "Matched uniform block names must also either all be lacking an instance name or all having an instance name: "
                                 ,&entKey->first);
                  TInfoSinkBase::message
                            (&this->infoSink->info,EPrefixInternalError,(char *)subType._8_8_);
                  *this->hadError = true;
                }
              }
            }
            iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar2);
            pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
            pbVar19 = this->hadError;
            if (*pbVar19 == false) {
              iVar8 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar2);
              iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar8) + 0x38))
                                ((long *)CONCAT44(extraout_var_13,iVar8));
              pbVar19 = this->hadError;
              if (iVar8 == 0x10) {
                if ((*pbVar19 & 1U) == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&subType,(entKey->first)._M_dataplus._M_p,
                             (allocator<char> *)&err_4);
                  bVar5 = true;
LAB_003757f9:
                  bVar5 = typeCheck(this,(TType *)CONCAT44(extraout_var_10,iVar7),pTVar14,
                                    (string *)&subType,bVar5);
                  *this->hadError = bVar5;
                  std::__cxx11::string::_M_dispose();
                  goto LAB_0037584e;
                }
              }
              else if ((*pbVar19 & 1U) == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&subType,(entKey->first)._M_dataplus._M_p,
                           (allocator<char> *)&err_4);
                bVar5 = false;
                goto LAB_003757f9;
              }
            }
            *pbVar19 = true;
          }
        }
LAB_0037584e:
        uVar18 = uVar18 + 1;
      } while( true );
    }
    if (language_00 == EShLangCount) {
      return;
    }
    iVar7 = (*(pTVar2->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(pTVar2);
    if (CONCAT44(extraout_var_05,iVar7) < 0x300000000000000) {
      return;
    }
    if (&this->inVarMaps[language_00]->_M_t ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         *)0x0) {
      return;
    }
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
             ::find(&this->inVarMaps[language_00]->_M_t,&entKey->first);
    if ((_Rb_tree_header *)iVar13._M_node ==
        &(this->inVarMaps[language_00]->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    plVar11 = (long *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    pTVar15 = (TQualifier *)(**(code **)(*plVar11 + 0x58))(plVar11);
    bVar5 = TQualifier::isArrayedIo(pTVar15,language_00);
    if (bVar5) {
      pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
      pTVar17 = &subType;
      TType::TType(pTVar17,pTVar14,0,false);
    }
    else {
      pTVar17 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    }
    TType::appendMangledName(pTVar17,&mangleName2);
    bVar5 = std::operator==(&mangleName1,&mangleName2);
    if (bVar5) {
      return;
    }
  }
  __lhs = "Invalid In/Out variable type : ";
LAB_00375be9:
  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &subType,__lhs,&entKey->first);
  TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,(char *)subType._8_8_);
  *this->hadError = true;
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey) {
        TVarEntryInfo& ent1 = entKey.second;
        TIntermSymbol* base = ent1.symbol;
        const TType& type = ent1.symbol->getType();
        const TString& name = entKey.first;
        TString mangleName1, mangleName2;
        EShLanguage stage = ent1.stage;
        EShLanguage preStage, currentStage, nextStage;

        preStage = EShLangCount;
        for (int i = stage - 1; i >= 0; i--) {
            if (inVarMaps[i] != nullptr) {
                preStage = static_cast<EShLanguage>(i);
                break;
            }
        }
        currentStage = stage;
        nextStage = EShLangCount;
        for (int i = stage + 1; i < EShLangCount; i++) {
            if (inVarMaps[i] != nullptr) {
                nextStage = static_cast<EShLanguage>(i);
                break;
            }
        }

        if (type.getQualifier().isArrayedIo(stage)) {
            TType subType(type, 0);
            subType.appendMangledName(mangleName1);
        } else {
            type.appendMangledName(mangleName1);
        }


        // basic checking that symbols match
        // more extensive checking in the link stage
        if (base->getQualifier().storage == EvqVaryingIn) {
            // validate stage in;
            if (preStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (outVarMaps[preStage] != nullptr) {
                auto ent2 = outVarMaps[preStage]->find(name);
                uint32_t location = base->getType().getQualifier().layoutLocation;
                if (ent2 == outVarMaps[preStage]->end() &&
                    location != glslang::TQualifier::layoutLocationEnd) {
                    for (auto var = outVarMaps[preStage]->begin(); var != ent2; var++) {
                        if (var->second.symbol->getType().getQualifier().layoutLocation == location) {
                            ent2 = var;
                            break;
                        }
                    }
                }
                if (ent2 != outVarMaps[preStage]->end()) {
                    auto& type1 = base->getType();
                    auto& type2 = ent2->second.symbol->getType();
                    hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(preStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }

                    if (mangleName1 == mangleName2) {
                        // For ES 3.0 only, other versions have no such restrictions
                        // According to ES 3.0 spec: The type and presence of the interpolation qualifiers and
                        // storage qualifiers  of variables with the same name declared in all linked shaders must
                        // match, otherwise the link command will fail.
                        if (profile == EEsProfile && version == 300) {
                            // Don't need to check smooth qualifier, as it uses the default interpolation mode
                            if (ent1.stage == EShLangFragment && type1.isBuiltIn() == false) {
                                if (type1.getQualifier().flat != type2.getQualifier().flat ||
                                    type1.getQualifier().nopersp != type2.getQualifier().nopersp) {
                                    TString err = "Interpolation qualifier mismatch : " + entKey.first;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                }
                            }
                        }
                        return;
                    }
                    else {
                        // Deal with input/output pairs where one is a block member but the other is loose,
                        // e.g. with ARB_separate_shader_objects
                        if (type1.getBasicType() == EbtBlock &&
                            type1.isStruct() && !type2.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type1.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName2
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        if (type2.getBasicType() == EbtBlock &&
                            type2.isStruct() && !type1.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type2.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName1
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                else if (!base->getType().isBuiltIn()) {
                    // According to spec: A link error is generated if any statically referenced input variable
                    // or block does not have a matching output
                    if (profile == EEsProfile && ent1.live) {
                        hadError = true;
                        TString errorStr = name + ": not been declare as a output variable in pre shader stage.";
                        infoSink.info.message(EPrefixError, errorStr.c_str());
                    }
                }
                return;
            }
        } else if (base->getQualifier().storage == EvqVaryingOut) {
            // validate stage out;
            if (nextStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (inVarMaps[nextStage] != nullptr) {
                auto ent2 = inVarMaps[nextStage]->find(name);
                if (ent2 != inVarMaps[nextStage]->end()) {
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(nextStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }
                    if (mangleName1 == mangleName2)
                        return;
                    else {
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                return;
            }
        } else if (base->getQualifier().isUniformOrBuffer() && !base->getQualifier().isPushConstant()) {
            // validate uniform type;
            for (int i = 0; i < EShLangCount; i++) {
                if (i != currentStage && outVarMaps[i] != nullptr) {
                    auto ent2 = uniformVarMap[i]->find(name);
                    if (ent2 != uniformVarMap[i]->end()) {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                        if (mangleName1 != mangleName2) {
                            ent2->second.symbol->getType().sameElementType(type);
                            TString err = "Invalid Uniform variable type : " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }
                        mangleName2.clear();

                        // validate instance name of blocks
                        if (hadError == false &&
                            base->getType().getBasicType() == EbtBlock &&
                            IsAnonymous(base->getName()) != IsAnonymous(ent2->second.symbol->getName())) {
                            TString err = "Matched uniform block names must also either all be lacking "
                                          "an instance name or all having an instance name: " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }

                        // validate uniform block member qualifier and member names
                        auto& type1 = base->getType();
                        auto& type2 = ent2->second.symbol->getType();
                        if (hadError == false && base->getType().getBasicType() == EbtBlock) {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), true);
                        }
                        else {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                        }
                    }
                    else if (base->getBasicType() == EbtBlock)
                    {
                        if (IsAnonymous(base->getName()))
                        {
                            // The name of anonymous block member can't same with default uniform variable.
                            auto blockType1 = base->getType().getStruct();
                            for (size_t memberIdx = 0; memberIdx < blockType1->size(); ++memberIdx) {
                                auto memberName = (*blockType1)[memberIdx].type->getFieldName();
                                if (uniformVarMap[i]->find(memberName) != uniformVarMap[i]->end())
                                {
                                    TString err = "Invalid Uniform variable name : " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
    }